

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

void nni_pipe_bump_tx(nni_pipe *p,size_t bytes)

{
  nni_stat_inc(&p->st_tx_bytes,bytes);
  nni_stat_inc(&p->st_tx_msgs,1);
  return;
}

Assistant:

void
nni_pipe_bump_tx(nni_pipe *p, size_t bytes)
{
#ifdef NNG_ENABLE_STATS
	nni_stat_inc(&p->st_tx_bytes, bytes);
	nni_stat_inc(&p->st_tx_msgs, 1);
#else
	NNI_ARG_UNUSED(p);
	NNI_ARG_UNUSED(bytes);
#endif
}